

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

LinkClosure * __thiscall cmTarget::GetLinkClosure(cmTarget *this,string *config)

{
  LinkClosure *this_00;
  bool bVar1;
  cmTargetInternals *pcVar2;
  pointer ppVar3;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_LinkClosure>_&>::value,_pair<iterator,_bool>_>
  _Var4;
  undefined1 local_e8 [8];
  value_type entry;
  LinkClosure lc;
  _Self local_40;
  iterator i;
  string key;
  string *config_local;
  cmTarget *this_local;
  
  cmsys::SystemTools::UpperCase((string *)&i,config);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>_>
       ::find(&pcVar2->LinkClosureMap,(key_type *)&i);
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  lc.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>_>
                ::end(&pcVar2->LinkClosureMap);
  bVar1 = std::operator==(&local_40,
                          (_Self *)&lc.Languages.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    this_00 = (LinkClosure *)
              &entry.second.Languages.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    LinkClosure::LinkClosure(this_00);
    ComputeLinkClosure(this,config,this_00);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::LinkClosure_&,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
                *)local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
               (LinkClosure *)
               &entry.second.Languages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    _Var4 = std::
            map<std::__cxx11::string,cmTarget::LinkClosure,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>>>
            ::insert<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>&>
                      ((map<std::__cxx11::string,cmTarget::LinkClosure,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::LinkClosure>>>
                        *)&pcVar2->LinkClosureMap,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
                        *)local_e8);
    local_40._M_node = (_Base_ptr)_Var4.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>
             *)local_e8);
    LinkClosure::~LinkClosure
              ((LinkClosure *)
               &entry.second.Languages.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkClosure>_>
           ::operator->(&local_40);
  std::__cxx11::string::~string((string *)&i);
  return &ppVar3->second;
}

Assistant:

cmTarget::LinkClosure const*
cmTarget::GetLinkClosure(const std::string& config) const
{
  std::string key(cmSystemTools::UpperCase(config));
  cmTargetInternals::LinkClosureMapType::iterator
    i = this->Internal->LinkClosureMap.find(key);
  if(i == this->Internal->LinkClosureMap.end())
    {
    LinkClosure lc;
    this->ComputeLinkClosure(config, lc);
    cmTargetInternals::LinkClosureMapType::value_type entry(key, lc);
    i = this->Internal->LinkClosureMap.insert(entry).first;
    }
  return &i->second;
}